

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O3

bool redit_rlist(CHAR_DATA *ch,char *argument)

{
  AREA_DATA_conflict *pAVar1;
  bool bVar2;
  int iVar3;
  BUFFER *buffer;
  ROOM_INDEX_DATA *pRVar4;
  char *pcVar5;
  int iVar6;
  bool bVar7;
  uint uVar8;
  char arg [4608];
  char buf [4608];
  char local_2438 [4608];
  char local_1238 [4616];
  
  one_argument(argument,local_2438);
  pAVar1 = ch->in_room->area;
  buffer = new_buf();
  if (pAVar1->min_vnum <= pAVar1->max_vnum) {
    bVar7 = false;
    iVar6 = 0;
    uVar8 = (int)pAVar1->min_vnum;
    do {
      pRVar4 = get_room_index(0);
      if (pRVar4 != (ROOM_INDEX_DATA *)0x0) {
        pcVar5 = capitalize(pRVar4->name);
        sprintf(local_1238,"[%5d] %-17.16s",(ulong)uVar8,pcVar5);
        add_buf(buffer,local_1238);
        iVar3 = iVar6 * -0x55555555;
        iVar6 = iVar6 + 1;
        bVar7 = true;
        if (iVar3 + 0xd5555555U < 0x55555555) {
          add_buf(buffer,"\n\r");
        }
      }
      bVar2 = (int)uVar8 < (int)pAVar1->max_vnum;
      uVar8 = uVar8 + 1;
    } while (bVar2);
    if (bVar7) {
      if (0x55555554 < iVar6 * -0x55555555 + 0x2aaaaaaaU) {
        add_buf(buffer,"\n\r");
      }
      pcVar5 = buf_string(buffer);
      page_to_char(pcVar5,ch);
      free_buf(buffer);
      return false;
    }
  }
  send_to_char("Room(s) not found in this area.\n\r",ch);
  return false;
}

Assistant:

bool redit_rlist(CHAR_DATA *ch, char *argument)
{
	ROOM_INDEX_DATA *pRoomIndex;
	AREA_DATA *pArea;
	char buf[MAX_STRING_LENGTH];
	BUFFER *buf1;
	char arg[MAX_INPUT_LENGTH];
	bool found;
	int vnum;
	int col = 0;

	one_argument(argument, arg);

	pArea = ch->in_room->area;
	buf1 = new_buf();
	/*    buf1[0] = '\0'; */
	found = false;

	for (vnum = pArea->min_vnum; vnum <= pArea->max_vnum; vnum++)
	{
		pRoomIndex = get_room_index(vnum);
		if (pRoomIndex)
		{
			found = true;

			sprintf(buf, "[%5d] %-17.16s", vnum, capitalize(pRoomIndex->name));
			add_buf(buf1, buf);

			if (++col % 3 == 0)
				add_buf(buf1, "\n\r");
		}
	}

	if (!found)
	{
		send_to_char("Room(s) not found in this area.\n\r", ch);
		return false;
	}

	if (col % 3 != 0)
		add_buf(buf1, "\n\r");

	page_to_char(buf_string(buf1), ch);
	free_buf(buf1);
	return false;
}